

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::LookAt
          (ParsedScene *this,Float ex,Float ey,Float ez,Float lx,Float ly,Float lz,Float ux,Float uy
          ,Float uz,FileLoc loc)

{
  Transform *pTVar1;
  int i;
  uint i_00;
  Transform lookAt;
  Vector3f local_140;
  Point3f local_134;
  Transform local_128;
  Transform local_a8;
  
  if (this->currentApiState == Uninitialized) {
    Error<char_const(&)[7]>
              (&loc,"pbrtInit() must be before calling \"%s()\". Ignoring.",(char (*) [7])"LookAt");
  }
  else {
    local_140.super_Tuple3<pbrt::Vector3,_float>.z = uz;
    local_140.super_Tuple3<pbrt::Vector3,_float>.x = ux;
    local_140.super_Tuple3<pbrt::Vector3,_float>.y = uy;
    local_134.super_Tuple3<pbrt::Point3,_float>.x = lx;
    local_134.super_Tuple3<pbrt::Point3,_float>.y = ly;
    local_134.super_Tuple3<pbrt::Point3,_float>.z = lz;
    local_128.m.m[0][0] = ex;
    local_128.m.m[0][1] = ey;
    local_128.m.m[0][2] = ez;
    pbrt::LookAt(&local_a8,(Point3f *)&local_128,&local_134,&local_140);
    for (i_00 = 0; i_00 != 2; i_00 = i_00 + 1) {
      if ((this->activeTransformBits >> (i_00 & 0x1f) & 1) != 0) {
        pTVar1 = TransformSet::operator[](&this->curTransform,i_00);
        pbrt::Transform::operator*(&local_128,pTVar1,&local_a8);
        pTVar1 = TransformSet::operator[](&this->curTransform,i_00);
        *(ulong *)(pTVar1->m).m[0] = CONCAT44(local_128.m.m[0][1],local_128.m.m[0][0]);
        *(ulong *)((pTVar1->m).m[0] + 2) = CONCAT44(local_128.m.m[0][3],local_128.m.m[0][2]);
        *(undefined8 *)(pTVar1->m).m[1] = local_128.m.m[1]._0_8_;
        *(undefined8 *)((pTVar1->m).m[1] + 2) = local_128.m.m[1]._8_8_;
        *(undefined8 *)(pTVar1->m).m[2] = local_128.m.m[2]._0_8_;
        *(undefined8 *)((pTVar1->m).m[2] + 2) = local_128.m.m[2]._8_8_;
        *(undefined8 *)(pTVar1->m).m[3] = local_128.m.m[3]._0_8_;
        *(undefined8 *)((pTVar1->m).m[3] + 2) = local_128.m.m[3]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[0] = local_128.mInv.m[0]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[0] + 2) = local_128.mInv.m[0]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[1] = local_128.mInv.m[1]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[1] + 2) = local_128.mInv.m[1]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[2] = local_128.mInv.m[2]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[2] + 2) = local_128.mInv.m[2]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[3] = local_128.mInv.m[3]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[3] + 2) = local_128.mInv.m[3]._8_8_;
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::LookAt(Float ex, Float ey, Float ez, Float lx, Float ly, Float lz,
                         Float ux, Float uy, Float uz, FileLoc loc) {
    VERIFY_INITIALIZED("LookAt");
    class Transform lookAt =
        pbrt::LookAt(Point3f(ex, ey, ez), Point3f(lx, ly, lz), Vector3f(ux, uy, uz));
    FOR_ACTIVE_TRANSFORMS(curTransform[i] = curTransform[i] * lookAt;);
}